

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

void __thiscall QtMWidgets::StepperPrivate::makeClick(StepperPrivate *this)

{
  int iStack_8;
  
  if (this->button == Plus) {
    if (this->plusButtonEnabled != true) {
      return;
    }
    iStack_8 = 1;
  }
  else {
    if ((this->button != Minus) || (this->minusButtonEnabled == false)) {
      return;
    }
    iStack_8 = -1;
  }
  Stepper::stepBy(this->q,iStack_8);
  return;
}

Assistant:

void
StepperPrivate::makeClick()
{
	switch( button )
	{
		case StepperPrivate::Minus :
		{
			if( minusButtonEnabled )
				q->stepBy( -1 );
		}
			break;

		case StepperPrivate::Plus :
		{
			if( plusButtonEnabled )
				q->stepBy( 1 );
		}
			break;

		default:
			break;
	}
}